

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPIPv4Address::IsFromSameHost(RTPIPv4Address *this,RTPAddress *addr)

{
  AddressType AVar1;
  uint32_t uVar2;
  RTPIPv4Address *addr2;
  RTPAddress *addr_local;
  RTPIPv4Address *this_local;
  
  if (addr == (RTPAddress *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    AVar1 = RTPAddress::GetAddressType(addr);
    if (AVar1 == IPv4Address) {
      uVar2 = GetIP((RTPIPv4Address *)addr);
      if (uVar2 == *(uint32_t *)&(this->super_RTPAddress).field_0xc) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTPIPv4Address::IsFromSameHost(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != IPv4Address)
		return false;
	
	const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
	if (addr2->GetIP() == ip)
		return true;
	return false;
}